

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O0

void __thiscall
spdlog::details::registry::set_default_logger
          (registry *this,shared_ptr<spdlog::logger> *new_default_logger)

{
  bool bVar1;
  element_type *this_00;
  lock_guard<std::mutex> lock;
  key_type *in_stack_ffffffffffffffa8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
  *in_stack_ffffffffffffffb0;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffb0,
             (mutex_type *)in_stack_ffffffffffffffa8);
  bVar1 = std::operator!=((shared_ptr<spdlog::logger> *)in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffa8);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x148273);
    logger::name_abi_cxx11_(this_00);
    in_stack_ffffffffffffffb0 =
         (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
          *)std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
            ::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::shared_ptr<spdlog::logger>::operator=
              ((shared_ptr<spdlog::logger> *)in_stack_ffffffffffffffb0,
               (shared_ptr<spdlog::logger> *)in_stack_ffffffffffffffa8);
  }
  std::shared_ptr<spdlog::logger>::operator=
            ((shared_ptr<spdlog::logger> *)in_stack_ffffffffffffffb0,
             (shared_ptr<spdlog::logger> *)in_stack_ffffffffffffffa8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1482e3);
  return;
}

Assistant:

SPDLOG_INLINE void registry::set_default_logger(std::shared_ptr<logger> new_default_logger) {
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    if (new_default_logger != nullptr) {
        loggers_[new_default_logger->name()] = new_default_logger;
    }
    default_logger_ = std::move(new_default_logger);
}